

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::CompilerGLSL::check_function_call_constraints
          (CompilerGLSL *this,uint32_t *args,uint32_t length)

{
  Variant *pVVar1;
  ulong uVar2;
  SPIRVariable *pSVar3;
  SPIRType *pSVar4;
  CompilerError *this_00;
  ulong uVar5;
  
  if (length != 0) {
    uVar5 = 0;
    do {
      uVar2 = (ulong)args[uVar5];
      if ((uVar2 < (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
                   buffer_size) &&
         (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.ptr
         , pVVar1[uVar2].type == TypeVariable)) {
        pSVar3 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar1 + uVar2);
      }
      else {
        pSVar3 = (SPIRVariable *)0x0;
      }
      if ((pSVar3 != (SPIRVariable *)0x0) && (pSVar3->remapped_variable == true)) {
        pSVar4 = Variant::get<diligent_spirv_cross::SPIRType>
                           ((this->super_Compiler).ir.ids.
                            super_VectorView<diligent_spirv_cross::Variant>.ptr +
                            *(uint *)&(pSVar3->super_IVariant).field_0xc);
        if ((pSVar4->basetype == Image) && ((pSVar4->image).dim == DimSubpassData)) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,
                     "Tried passing a remapped subpassInput variable to a function. This will not work correctly because type-remapping information is lost. To workaround, please consider not passing the subpass input as a function parameter, or use in/out variables instead which do not need type remapping information."
                    );
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      uVar5 = uVar5 + 1;
    } while (length != uVar5);
  }
  return;
}

Assistant:

void CompilerGLSL::check_function_call_constraints(const uint32_t *args, uint32_t length)
{
	// If our variable is remapped, and we rely on type-remapping information as
	// well, then we cannot pass the variable as a function parameter.
	// Fixing this is non-trivial without stamping out variants of the same function,
	// so for now warn about this and suggest workarounds instead.
	for (uint32_t i = 0; i < length; i++)
	{
		auto *var = maybe_get<SPIRVariable>(args[i]);
		if (!var || !var->remapped_variable)
			continue;

		auto &type = get<SPIRType>(var->basetype);
		if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData)
		{
			SPIRV_CROSS_THROW("Tried passing a remapped subpassInput variable to a function. "
			                  "This will not work correctly because type-remapping information is lost. "
			                  "To workaround, please consider not passing the subpass input as a function parameter, "
			                  "or use in/out variables instead which do not need type remapping information.");
		}
	}
}